

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O3

void __thiscall SerialTaskRunner::flush(SerialTaskRunner *this)

{
  undefined1 *puVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock11;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CScheduler::AreThreadsServicingQueue(this->m_scheduler);
  if (bVar2) {
    __assert_fail("!m_scheduler.AreThreadsServicingQueue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/scheduler.cpp"
                  ,0xbb,"virtual void SerialTaskRunner::flush()");
  }
  do {
    ProcessQueue(this);
    local_40._M_owns = false;
    local_40._M_device = &(this->m_callbacks_mutex).super_mutex;
    std::unique_lock<std::mutex>::lock(&local_40);
    puVar1 = *(undefined1 **)&this->m_callbacks_pending;
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)puVar1 !=
           &this->m_callbacks_pending);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::flush()
{
    assert(!m_scheduler.AreThreadsServicingQueue());
    bool should_continue = true;
    while (should_continue) {
        ProcessQueue();
        LOCK(m_callbacks_mutex);
        should_continue = !m_callbacks_pending.empty();
    }
}